

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

const_iterator * __thiscall
llvm::sys::path::begin(const_iterator *__return_storage_ptr__,path *this,StringRef path,Style style)

{
  path pVar1;
  int iVar2;
  Style SVar3;
  size_t From;
  char *pcVar4;
  StringRef Chars;
  StringRef local_38;
  
  pcVar4 = path.Data;
  SVar3 = (Style)path.Length;
  (__return_storage_ptr__->Path).Data = (char *)0x0;
  (__return_storage_ptr__->Path).Length = 0;
  (__return_storage_ptr__->Component).Data = (char *)0x0;
  (__return_storage_ptr__->Component).Length = 0;
  (__return_storage_ptr__->Path).Data = (char *)this;
  (__return_storage_ptr__->Path).Length = (size_t)pcVar4;
  if (pcVar4 == (char *)0x0) goto LAB_001581d3;
  local_38.Data = (char *)this;
  local_38.Length = (size_t)pcVar4;
  if (((pcVar4 != (char *)0x1 && SVar3 == windows) &&
      (iVar2 = isalpha((uint)(byte)*this), iVar2 != 0)) && (this[1] == (path)0x3a)) {
    if ((char *)0x1 < pcVar4) {
      pcVar4 = (char *)0x2;
    }
    goto LAB_001581d3;
  }
  if (pcVar4 < (char *)0x3) {
LAB_0015817b:
    pcVar4 = (char *)0x1;
    if ((*this == (path)0x2f) || (SVar3 == windows && *this == (path)0x5c)) goto LAB_001581d3;
    pcVar4 = "/";
    if (SVar3 == windows) {
      pcVar4 = "\\/";
    }
    From = 0;
  }
  else {
    pVar1 = *this;
    if (((pVar1 != (path)0x2f) && (SVar3 != windows || pVar1 != (path)0x5c)) || (pVar1 != this[1]))
    goto LAB_0015817b;
    if ((this[2] == (path)0x2f) || (SVar3 == windows && this[2] == (path)0x5c)) goto LAB_0015817b;
    pcVar4 = "/";
    if (SVar3 == windows) {
      pcVar4 = "\\/";
    }
    From = 2;
  }
  Chars.Length = (ulong)(SVar3 == windows) + 1;
  Chars.Data = pcVar4;
  pcVar4 = (char *)StringRef::find_first_of(&local_38,Chars,From);
  this = (path *)local_38.Data;
  if (local_38.Length < pcVar4) {
    pcVar4 = (char *)local_38.Length;
  }
LAB_001581d3:
  (__return_storage_ptr__->Component).Data = (char *)this;
  (__return_storage_ptr__->Component).Length = (size_t)pcVar4;
  __return_storage_ptr__->Position = 0;
  __return_storage_ptr__->S = SVar3;
  return __return_storage_ptr__;
}

Assistant:

const_iterator begin(StringRef path, Style style) {
  const_iterator i;
  i.Path      = path;
  i.Component = find_first_component(path, style);
  i.Position  = 0;
  i.S = style;
  return i;
}